

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O2

int emit_newname_block(nghttp2_bufs *bufs,nghttp2_nv *nv,int indexing_mode)

{
  uint8_t b;
  int iVar1;
  
  b = pack_first_byte(indexing_mode);
  iVar1 = nghttp2_bufs_addb(bufs,b);
  if (iVar1 == 0) {
    iVar1 = emit_string(bufs,nv->name,nv->namelen);
    if (iVar1 == 0) {
      iVar1 = emit_string(bufs,nv->value,nv->valuelen);
      return iVar1;
    }
  }
  return iVar1;
}

Assistant:

static int emit_newname_block(nghttp2_bufs *bufs, const nghttp2_nv *nv,
                              int indexing_mode) {
  int rv;

  DEBUGF(
      "deflatehd: emit newname namelen=%zu, valuelen=%zu, indexing_mode=%d\n",
      nv->namelen, nv->valuelen, indexing_mode);

  rv = nghttp2_bufs_addb(bufs, pack_first_byte(indexing_mode));
  if (rv != 0) {
    return rv;
  }

  rv = emit_string(bufs, nv->name, nv->namelen);
  if (rv != 0) {
    return rv;
  }

  rv = emit_string(bufs, nv->value, nv->valuelen);
  if (rv != 0) {
    return rv;
  }

  return 0;
}